

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O0

void __thiscall
protozero::basic_pbf_writer<std::__cxx11::string>::
add_packed_fixed32<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>>
          (basic_pbf_writer<std::__cxx11::string> *this,pbf_tag_type tag,
          istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *first,
          istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *last)

{
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_48;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_38;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *local_28;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *last_local;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> *first_local;
  basic_pbf_writer<std::__cxx11::string> *pbStack_10;
  pbf_tag_type tag_local;
  basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_28 = last;
  last_local = first;
  first_local._4_4_ = tag;
  pbStack_10 = this;
  std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_38,first);
  std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::istream_iterator
            (&local_48,last);
  add_packed_fixed<unsigned_int,std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>>
            (this,tag,&local_38,&local_48);
  return;
}

Assistant:

void add_packed_fixed32(pbf_tag_type tag, InputIterator first, InputIterator last) { // NOLINT(performance-unnecessary-value-param)
        add_packed_fixed<uint32_t, InputIterator>(tag, first, last,
            typename std::iterator_traits<InputIterator>::iterator_category{});
    }